

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.c
# Opt level: O0

void build_scanners(Grammar *g)

{
  State *pSVar1;
  LexState *ls_00;
  LexState *ls;
  State *s;
  uint local_18;
  uint k;
  uint j;
  uint i;
  Grammar *g_local;
  
  ls_00 = new_LexState();
  k = 0;
  do {
    if ((g->states).n <= k) {
      for (k = 0; k < (g->states).n; k = k + 1) {
        pSVar1 = (g->states).v[k];
        if ((pSVar1->shift_actions).n != 0) {
          if (pSVar1->same_shifts == (State *)0x0) {
            build_state_scanner(g,ls_00,pSVar1);
          }
          else {
            memcpy(&pSVar1->scanner,&pSVar1->same_shifts->scanner,0x50);
          }
        }
      }
      if (d_verbose_level != 0) {
        printf("%d scanners %d transitions\n",(ulong)ls_00->scanners,(ulong)ls_00->transitions);
      }
      free(ls_00);
      return;
    }
    pSVar1 = (g->states).v[k];
    if (pSVar1->same_shifts == (State *)0x0) {
      for (local_18 = 0; local_18 < k; local_18 = local_18 + 1) {
        if ((((g->states).v[local_18]->same_shifts == (State *)0x0) &&
            (((g->states).v[local_18]->shift_actions).n == (pSVar1->shift_actions).n)) &&
           (((byte)(g->states).v[local_18]->field_0x178 >> 3 & 7) ==
            ((byte)pSVar1->field_0x178 >> 3 & 7))) {
          s._4_4_ = 0;
          while ((s._4_4_ < ((g->states).v[local_18]->shift_actions).n &&
                 ((pSVar1->shift_actions).v[s._4_4_]->term ==
                  ((g->states).v[local_18]->shift_actions).v[s._4_4_]->term))) {
            s._4_4_ = s._4_4_ + 1;
          }
          if (((g->states).v[local_18]->shift_actions).n <= s._4_4_) {
            pSVar1->same_shifts = (g->states).v[local_18];
            break;
          }
        }
      }
    }
    k = k + 1;
  } while( true );
}

Assistant:

void build_scanners(Grammar *g) {
  uint i, j, k;
  State *s;
  LexState *ls = new_LexState();

  /* detect identical scanners */
  for (i = 0; i < g->states.n; i++) {
    s = g->states.v[i];
    if (s->same_shifts) continue;
    for (j = 0; j < i; j++) {
      if (g->states.v[j]->same_shifts) continue;
      if (g->states.v[j]->shift_actions.n != s->shift_actions.n) continue;
      if (g->states.v[j]->scan_kind != s->scan_kind) continue;
      for (k = 0; k < g->states.v[j]->shift_actions.n; k++)
        if (s->shift_actions.v[k]->term != g->states.v[j]->shift_actions.v[k]->term) break;
      if (k >= g->states.v[j]->shift_actions.n) {
        s->same_shifts = g->states.v[j];
        break;
      }
    }
  }
  /* build scanners */
  for (i = 0; i < g->states.n; i++) {
    s = g->states.v[i];
    if (s->shift_actions.n) {
      if (s->same_shifts)
        s->scanner = s->same_shifts->scanner;
      else
        build_state_scanner(g, ls, s);
    }
  }
  if (d_verbose_level) printf("%d scanners %d transitions\n", ls->scanners, ls->transitions);
  FREE(ls);
}